

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::anon_unknown_8::LogFileObject::FlushUnlocked(LogFileObject *this,time_point *now)

{
  FILE *__stream;
  
  __stream = (FILE *)(this->file_)._M_t.
                     super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  if (__stream != (FILE *)0x0) {
    fflush(__stream);
    this->bytes_since_flush_ = 0;
  }
  (this->next_flush_time_).__d.__r = (long)fLI::FLAGS_logbufsecs * 1000000000 + (now->__d).__r;
  return;
}

Assistant:

void LogFileObject::FlushUnlocked(
    const std::chrono::system_clock::time_point& now) {
  if (file_ != nullptr) {
    fflush(file_.get());
    bytes_since_flush_ = 0;
  }
  // Figure out when we are due for another flush.
  next_flush_time_ =
      now + std::chrono::duration_cast<std::chrono::system_clock::duration>(
                std::chrono::duration<int32>{FLAGS_logbufsecs});
}